

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O1

string * __thiscall
dtc::text_input_buffer::parse_node_or_property_name_abi_cxx11_
          (string *__return_storage_ptr__,text_input_buffer *this,bool *is_property)

{
  element_type *peVar1;
  bool bVar2;
  _Elt_pointer psVar3;
  int iVar4;
  char cVar5;
  char c;
  vector<char,_std::allocator<char>_> bytes;
  char local_59;
  void *local_58;
  iterator iStack_50;
  char *local_48;
  string *local_38;
  
  if (*is_property == true) {
    parse_property_name_abi_cxx11_(__return_storage_ptr__,this);
  }
  else {
    local_58 = (void *)0x0;
    iStack_50._M_current = (char *)0x0;
    local_48 = (char *)0x0;
    psVar3 = (this->input_stack).c.
             super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (psVar3 == (this->input_stack).c.
                  super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      cVar5 = '\0';
    }
    else {
      if (psVar3 == (this->input_stack).c.
                    super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        psVar3 = (this->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      peVar1 = psVar3[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar4 = peVar1->cursor;
      cVar5 = '\0';
      if ((-1 < (long)iVar4) && (cVar5 = '\0', iVar4 < peVar1->size)) {
        cVar5 = peVar1->buffer[iVar4];
      }
    }
    local_59 = cVar5;
    local_38 = __return_storage_ptr__;
    bVar2 = anon_unknown_1::is_node_name_character::check(cVar5);
    if (bVar2) {
      do {
        if (iStack_50._M_current == local_48) {
          std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                    ((vector<char,std::allocator<char>> *)&local_58,iStack_50,&local_59);
        }
        else {
          *iStack_50._M_current = cVar5;
          iStack_50._M_current = iStack_50._M_current + 1;
        }
        psVar3 = (this->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (psVar3 != (this->input_stack).c.
                      super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          this->cursor = this->cursor + 1;
          if (psVar3 == (this->input_stack).c.
                        super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            psVar3 = (this->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          peVar1 = psVar3[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar4 = peVar1->cursor + 1;
          peVar1->cursor = iVar4;
          if (peVar1->size <= iVar4) {
            std::
            deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
            ::pop_back(&(this->input_stack).c);
          }
        }
        psVar3 = (this->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (psVar3 == (this->input_stack).c.
                      super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          cVar5 = '\0';
        }
        else {
          if (psVar3 == (this->input_stack).c.
                        super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            psVar3 = (this->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          peVar1 = psVar3[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar4 = peVar1->cursor;
          cVar5 = '\0';
          if ((-1 < (long)iVar4) && (iVar4 < peVar1->size)) {
            cVar5 = peVar1->buffer[iVar4];
          }
        }
        local_59 = cVar5;
        bVar2 = anon_unknown_1::is_node_name_character::check(cVar5);
      } while (bVar2);
    }
    psVar3 = (this->input_stack).c.
             super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (psVar3 == (this->input_stack).c.
                  super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      cVar5 = '\0';
    }
    else {
      if (psVar3 == (this->input_stack).c.
                    super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        psVar3 = (this->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      peVar1 = psVar3[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar4 = peVar1->cursor;
      cVar5 = '\0';
      if ((-1 < (long)iVar4) && (iVar4 < peVar1->size)) {
        cVar5 = peVar1->buffer[iVar4];
      }
    }
    local_59 = cVar5;
    bVar2 = anon_unknown_1::is_property_name_character::check(cVar5);
    if (bVar2) {
      do {
        if (iStack_50._M_current == local_48) {
          std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                    ((vector<char,std::allocator<char>> *)&local_58,iStack_50,&local_59);
        }
        else {
          *iStack_50._M_current = cVar5;
          iStack_50._M_current = iStack_50._M_current + 1;
        }
        *is_property = true;
        psVar3 = (this->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (psVar3 != (this->input_stack).c.
                      super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          this->cursor = this->cursor + 1;
          if (psVar3 == (this->input_stack).c.
                        super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            psVar3 = (this->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          peVar1 = psVar3[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar4 = peVar1->cursor + 1;
          peVar1->cursor = iVar4;
          if (peVar1->size <= iVar4) {
            std::
            deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
            ::pop_back(&(this->input_stack).c);
          }
        }
        psVar3 = (this->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (psVar3 == (this->input_stack).c.
                      super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          cVar5 = '\0';
        }
        else {
          if (psVar3 == (this->input_stack).c.
                        super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            psVar3 = (this->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          peVar1 = psVar3[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar4 = peVar1->cursor;
          cVar5 = '\0';
          if ((-1 < (long)iVar4) && (iVar4 < peVar1->size)) {
            cVar5 = peVar1->buffer[iVar4];
          }
        }
        local_59 = cVar5;
        bVar2 = anon_unknown_1::is_property_name_character::check(cVar5);
      } while (bVar2);
    }
    __return_storage_ptr__ = local_38;
    (local_38->_M_dataplus)._M_p = (pointer)&local_38->field_2;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              ((string *)local_38,local_58,iStack_50._M_current);
    if (local_58 != (void *)0x0) {
      operator_delete(local_58,(long)local_48 - (long)local_58);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string
text_input_buffer::parse_node_or_property_name(bool &is_property)
{
	if (is_property)
	{
		return parse_property_name();
	}
	std::vector<char> bytes;
	for (char c=*(*this) ; is_node_name_character::check(c) ; c=*(++(*this)))
	{
		bytes.push_back(c);
	}
	for (char c=*(*this) ; is_property_name_character::check(c) ; c=*(++(*this)))
	{
		bytes.push_back(c);
		is_property = true;
	}
	return string(bytes.begin(), bytes.end());
}